

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Model::set_allocated_soundanalysispreprocessing
          (Model *this,SoundAnalysisPreprocessing *soundanalysispreprocessing)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (soundanalysispreprocessing != (SoundAnalysisPreprocessing *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(soundanalysispreprocessing->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      soundanalysispreprocessing =
           (SoundAnalysisPreprocessing *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&soundanalysispreprocessing->super_MessageLite,submessage_arena)
      ;
    }
    this->_oneof_case_[0] = 0x7d3;
    (this->Type_).soundanalysispreprocessing_ = soundanalysispreprocessing;
  }
  return;
}

Assistant:

void Model::set_allocated_soundanalysispreprocessing(::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing* soundanalysispreprocessing) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (soundanalysispreprocessing) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(soundanalysispreprocessing));
    if (message_arena != submessage_arena) {
      soundanalysispreprocessing = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, soundanalysispreprocessing, submessage_arena);
    }
    set_has_soundanalysispreprocessing();
    Type_.soundanalysispreprocessing_ = soundanalysispreprocessing;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.soundAnalysisPreprocessing)
}